

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_1;
  ParenthesizedBinsSelectExprSyntax *pPVar1;
  DeepCloneVisitor visitor;
  Token local_48;
  Token local_38;
  
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x28),(DeepCloneVisitor *)&local_48,
                      (BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x30),(BumpAllocator *)__child_stack);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::ParenthesizedBinsSelectExprSyntax,slang::parsing::Token,slang::syntax::BinsSelectExpressionSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_38,(BinsSelectExpressionSyntax *)args_1,
                      &local_48);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const ParenthesizedBinsSelectExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ParenthesizedBinsSelectExprSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone<BinsSelectExpressionSyntax>(*node.expr, alloc),
        node.closeParen.deepClone(alloc)
    );
}